

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::TextureViewGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::TextureViewGLImpl>::operator=
          (RefCntAutoPtr<Diligent::TextureViewGLImpl> *this,TextureViewGLImpl *pObj)

{
  TextureViewGLImpl *pObj_local;
  RefCntAutoPtr<Diligent::TextureViewGLImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (TextureViewGLImpl *)0x0) {
      DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
      ::Release((DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
                 *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (TextureViewGLImpl *)0x0) {
      RefCountedObject<Diligent::ITextureViewGL>::AddRef
                ((RefCountedObject<Diligent::ITextureViewGL> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }